

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

Side __thiscall Application::convert(Application *this,Side *side)

{
  char cVar1;
  Side SVar2;
  logic_error *this_00;
  
  cVar1 = FIX::CharField::getValue(&side->super_CharField);
  SVar2 = buy;
  if (cVar1 != '1') {
    if (cVar1 != '2') {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Unsupported Side, use buy or sell");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    SVar2 = sell;
  }
  return SVar2;
}

Assistant:

Order::Side Application::convert(const FIX::Side &side) {
  switch (side) {
  case FIX::Side_BUY:
    return Order::buy;
  case FIX::Side_SELL:
    return Order::sell;
  default:
    throw std::logic_error("Unsupported Side, use buy or sell");
  }
}